

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O0

int Llb_Nonlin4HasSingletonVars(Llb_Mgr_t_conflict *p,Llb_Prt_t *pPart)

{
  int iVar1;
  Llb_Var_t *pLVar2;
  int local_2c;
  int i;
  Llb_Var_t *pVar;
  Llb_Prt_t *pPart_local;
  Llb_Mgr_t_conflict *p_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pPart->vVars);
    if (iVar1 <= local_2c) {
      return 0;
    }
    iVar1 = Vec_IntEntry(pPart->vVars,local_2c);
    pLVar2 = Llb_MgrVar(p,iVar1);
    iVar1 = Vec_IntSize(pLVar2->vParts);
    if (iVar1 == 1) break;
    local_2c = local_2c + 1;
  }
  return 1;
}

Assistant:

int Llb_Nonlin4HasSingletonVars( Llb_Mgr_t * p, Llb_Prt_t * pPart )
{
    Llb_Var_t * pVar;
    int i;
    Llb_PartForEachVar( p, pPart, pVar, i )
        if ( Vec_IntSize(pVar->vParts) == 1 )
            return 1;
    return 0;
}